

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase41::run(TestCase41 *this)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined4 uVar3;
  void *pvVar4;
  undefined4 uVar5;
  int iVar6;
  Schema SVar7;
  StructSchema SVar8;
  size_t sVar9;
  bool bVar10;
  Reader RVar11;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StructSchema schema;
  Field field;
  Fault f;
  Field lookup;
  CapTableReader local_260;
  undefined1 local_258 [24];
  uint local_240;
  BitsPerElementN<23> BStack_23c;
  void *local_230;
  short local_224;
  undefined4 local_220;
  Fault local_218;
  uint local_210;
  uint local_20c;
  undefined1 local_208 [16];
  SegmentReader *local_1f8;
  WirePointer *pWStack_1f0;
  undefined8 local_1e8;
  WirePointer *pWStack_1e0;
  uint local_1d8;
  undefined1 local_1c8 [40];
  WirePointer *pWStack_1a0;
  undefined1 local_190 [8];
  undefined1 local_188 [344];
  
  local_260._vptr_CapTableReader = (_func_int **)(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto((Reader *)local_190,(Schema *)&local_260);
  bVar10 = true;
  if (0x3f < (uint)local_188._24_4_) {
    bVar10 = *(long *)local_188._8_8_ != -0x5f570ceb47f49c03;
  }
  if ((bVar10) && (kj::_::Debug::minSeverity < 3)) {
    local_258._0_8_ = (_func_int **)0xa0a8f314b80b63fd;
    Schema::getProto((Reader *)local_190,(Schema *)&local_260);
    if ((uint)local_188._24_4_ < 0x40) {
      local_208._0_8_ = (RawBrandedSchema *)0x0;
    }
    else {
      local_208._0_8_ = *(undefined8 *)local_188._8_8_;
    }
    kj::_::Debug::log<char_const(&)[73],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(typeId<TestAllTypes>()) == (schema.getProto().getId())\", typeId<TestAllTypes>(), schema.getProto().getId()"
               ,(char (*) [73])
                "failed: expected (typeId<TestAllTypes>()) == (schema.getProto().getId())",
               (unsigned_long *)local_258,(unsigned_long *)local_208);
  }
  SVar7 = Schema::getDependency((Schema *)&local_260,0x9c8e9318b29d9cd3,0);
  if ((SVar7.raw != (RawBrandedSchema *)(schemas::s_9c8e9318b29d9cd3 + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[86]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2e,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()\""
               ,(char (*) [86])
                "failed: expected schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()"
              );
  }
  SVar7 = Schema::getDependency((Schema *)&local_260,0x9c8e9318b29d9cd3,0);
  if ((SVar7.raw == (RawBrandedSchema *)local_260._vptr_CapTableReader) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[68]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2f,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) != schema\"",
               (char (*) [68])"failed: expected schema.getDependency(typeId<TestEnum>()) != schema")
    ;
  }
  SVar7 = Schema::getDependency((Schema *)&local_260,0xa0a8f314b80b63fd,0);
  if ((SVar7.raw != (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[94]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()\""
               ,(char (*) [94])
                "failed: expected schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()"
              );
  }
  SVar7 = Schema::getDependency((Schema *)&local_260,0xa0a8f314b80b63fd,0);
  if ((SVar7.raw != (RawBrandedSchema *)local_260._vptr_CapTableReader) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x31,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == schema\"",
               (char (*) [72])
               "failed: expected schema.getDependency(typeId<TestAllTypes>()) == schema");
  }
  local_258._0_8_ = &PTR_run_0062f628;
  local_258._8_8_ = &local_260;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_190,(Runnable *)local_258);
  if (local_190[0] == true) {
    kj::Exception::~Exception((Exception *)(local_190 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[111]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x32,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != nullptr\""
               ,(char (*) [111])
                "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != nullptr"
              );
  }
  SVar8 = Schema::asStruct((Schema *)&local_260);
  if ((SVar8.super_Schema.raw != (Schema)local_260._vptr_CapTableReader) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x34,ERROR,"\"failed: expected \" \"schema.asStruct() == schema\"",
               (char (*) [45])"failed: expected schema.asStruct() == schema");
  }
  local_258._0_8_ = &PTR_run_0062f658;
  local_258._8_8_ = &local_260;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_190,(Runnable *)local_258);
  if (local_190[0] == true) {
    kj::Exception::~Exception((Exception *)(local_190 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[82]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asEnum(); }) != nullptr\""
               ,(char (*) [82])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asEnum(); }) != nullptr")
    ;
  }
  local_258._0_8_ = &PTR_run_0062f688;
  local_258._8_8_ = &local_260;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_190,(Runnable *)local_258);
  if (local_190[0] == true) {
    kj::Exception::~Exception((Exception *)(local_190 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[87]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x36,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asInterface(); }) != nullptr\""
               ,(char (*) [87])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asInterface(); }) != nullptr"
              );
  }
  StructSchema::getFields((FieldList *)local_190,(StructSchema *)&local_260);
  uVar3 = local_188._24_4_;
  Schema::getProto((Reader *)local_208,(Schema *)&local_260);
  if (local_1e8._4_2_ < 4) {
    pWStack_1e0._0_4_ = 0x7fffffff;
    local_1c8._8_8_ = (SegmentReader *)0x0;
    local_1c8._16_8_ = (SegmentReader *)0x0;
    local_1c8._0_8_ = (RawBrandedSchema *)0x0;
  }
  else {
    local_1c8._16_8_ = pWStack_1f0 + 3;
    local_1c8._8_8_ = local_208._8_8_;
    local_1c8._0_8_ = local_208._0_8_;
  }
  local_1c8._24_4_ = (int)pWStack_1e0;
  PointerReader::getList
            ((ListReader *)local_258,(PointerReader *)local_1c8,INLINE_COMPOSITE,(word *)0x0);
  if (uVar3 == local_240) {
    StructSchema::getFields((FieldList *)local_190,(StructSchema *)&local_260);
    sVar9 = 0;
    ListReader::getStructElement((StructReader *)(local_258 + 0x10),(ListReader *)(local_190 + 8),0)
    ;
    local_258._0_8_ = local_190;
    local_258._8_8_ = local_258._8_8_ & 0xffffffff00000000;
    if (local_224 == 0) {
      local_188._16_4_ = 0x7fffffff;
      local_188._8_8_ = (void *)0x0;
      local_190 = (undefined1  [8])0x0;
    }
    else {
      sVar9 = CONCAT44(BStack_23c,local_240);
      local_188._8_8_ = local_230;
      local_190 = (undefined1  [8])local_258._16_8_;
      local_188._16_4_ = local_220;
    }
    local_188._0_8_ = sVar9;
    RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_190,(void *)0x0,0);
    pvVar4 = local_230;
    uVar5 = local_220;
    pvVar2 = (void *)local_188._8_8_;
    uVar3 = local_188._16_4_;
    if (((RVar11.super_StringPtr.content.size_ != 10) ||
        (iVar6 = bcmp(RVar11.super_StringPtr.content.ptr,"voidField",9),
        pvVar2 = (void *)local_188._8_8_, uVar3 = local_188._16_4_, pvVar4 = local_230,
        uVar5 = local_220, iVar6 != 0)) &&
       (local_188._16_4_ = uVar5, local_188._8_8_ = pvVar4, kj::_::Debug::minSeverity < 3)) {
      if (local_224 == 0) {
        local_188._16_4_ = 0x7fffffff;
        local_188._0_8_ = 0;
        local_188._8_8_ = (void *)0x0;
        local_258._16_8_ = (byte *)0x0;
      }
      else {
        local_188._0_8_ = CONCAT44(BStack_23c,local_240);
      }
      local_190 = (undefined1  [8])local_258._16_8_;
      _local_190 = (ArrayPtr<const_char>)
                   PointerReader::getBlob<capnp::Text>((PointerReader *)local_190,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[63],char_const(&)[10],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3a,ERROR,
                 "\"failed: expected \" \"(\\\"voidField\\\") == (field.getProto().getName())\", \"voidField\", field.getProto().getName()"
                 ,(char (*) [63])"failed: expected (\"voidField\") == (field.getProto().getName())",
                 (char (*) [10])"voidField",(Reader *)local_190);
      pvVar2 = (void *)local_188._8_8_;
      uVar3 = local_188._16_4_;
    }
    local_188._16_4_ = uVar3;
    local_188._8_8_ = pvVar2;
    if (((_func_int **)local_258._0_8_ != local_260._vptr_CapTableReader) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3b,ERROR,"\"failed: expected \" \"field.getContainingStruct() == schema\"",
                 (char (*) [55])"failed: expected field.getContainingStruct() == schema");
    }
    name.content.size_ = 10;
    name.content.ptr = "voidField";
    StructSchema::getFieldByName((Field *)local_208,(StructSchema *)&local_260,name);
    if ((local_208._8_4_ != local_258._8_4_ || local_208._0_8_ != local_258._0_8_) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3e,ERROR,"\"failed: expected \" \"lookup == field\"",
                 (char (*) [33])"failed: expected lookup == field");
    }
    StructSchema::getFields((FieldList *)local_1c8,(StructSchema *)&local_260);
    uVar1 = local_1c8._0_8_;
    ListReader::getStructElement((StructReader *)(local_188 + 8),(ListReader *)(local_1c8 + 8),1);
    if (((local_208._0_8_ == uVar1) && (local_208._8_4_ == 1)) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3f,ERROR,"\"failed: expected \" \"lookup != schema.getFields()[1]\"",
                 (char (*) [49])"failed: expected lookup != schema.getFields()[1]");
    }
    if (((0x80 < local_1d8) && ((*(byte *)((long)local_1e8 + 0x10) & 1) != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[72]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"!(lookup.getProto().getSlot().getHadExplicitDefault())\"",
                 (char (*) [72])
                 "failed: expected !(lookup.getProto().getSlot().getHadExplicitDefault())");
    }
    name_00.content.size_ = 0xb;
    name_00.content.ptr = "int32Field";
    StructSchema::getFieldByName((Field *)local_190,(StructSchema *)&local_260,name_00);
    if (((0x80 < (uint)local_188._40_4_) &&
        ((*(byte *)(CONCAT44(local_188._28_4_,local_188._24_4_) + 0x10) & 1) != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[101]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"!(schema.getFieldByName(\\\"int32Field\\\").getProto().getSlot().getHadExplicitDefault())\""
                 ,(char (*) [101])
                  "failed: expected !(schema.getFieldByName(\"int32Field\").getProto().getSlot().getHadExplicitDefault())"
                );
    }
    local_1c8._0_8_ = (long)schemas::s_eb3f9ebe98c73cb6 + 0x48;
    name_01.content.size_ = 0xb;
    name_01.content.ptr = "int32Field";
    StructSchema::getFieldByName((Field *)local_190,(StructSchema *)local_1c8,name_01);
    if ((((uint)local_188._40_4_ < 0x81) ||
        ((*(byte *)(CONCAT44(local_188._28_4_,local_188._24_4_) + 0x10) & 1) == 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[121]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x45,ERROR,
                 "\"failed: expected \" \"Schema::from<TestDefaults>().getFieldByName(\\\"int32Field\\\") .getProto().getSlot().getHadExplicitDefault()\""
                 ,(char (*) [121])
                  "failed: expected Schema::from<TestDefaults>().getFieldByName(\"int32Field\") .getProto().getSlot().getHadExplicitDefault()"
                );
    }
    name_02.content.size_ = 0xc;
    name_02.content.ptr = "noSuchField";
    StructSchema::findFieldByName
              ((Maybe<capnp::StructSchema::Field> *)local_190,(StructSchema *)&local_260,name_02);
    if ((local_190[0] == true) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x47,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"noSuchField\\\") == nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"noSuchField\") == nullptr");
    }
    name_03.content.size_ = 0xb;
    name_03.content.ptr = "int32Field";
    StructSchema::findFieldByName
              ((Maybe<capnp::StructSchema::Field> *)local_190,(StructSchema *)&local_260,name_03);
    if ((local_190[0] == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x49,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"int32Field\\\") != nullptr\"",
                 (char (*) [65])"failed: expected schema.findFieldByName(\"int32Field\") != nullptr"
                );
    }
    name_04.content.size_ = 0xc;
    name_04.content.ptr = "float32List";
    StructSchema::findFieldByName
              ((Maybe<capnp::StructSchema::Field> *)local_190,(StructSchema *)&local_260,name_04);
    if ((local_190[0] == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4a,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"float32List\\\") != nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"float32List\") != nullptr");
    }
    name_05.content.size_ = 9;
    name_05.content.ptr = "dataList";
    StructSchema::findFieldByName
              ((Maybe<capnp::StructSchema::Field> *)local_190,(StructSchema *)&local_260,name_05);
    if ((local_190[0] == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4b,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"dataList\\\") != nullptr\"",
                 (char (*) [63])"failed: expected schema.findFieldByName(\"dataList\") != nullptr");
    }
    name_06.content.size_ = 10;
    name_06.content.ptr = "textField";
    StructSchema::findFieldByName
              ((Maybe<capnp::StructSchema::Field> *)local_190,(StructSchema *)&local_260,name_06);
    if ((local_190[0] == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[64]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4c,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"textField\\\") != nullptr\"",
                 (char (*) [64])"failed: expected schema.findFieldByName(\"textField\") != nullptr")
      ;
    }
    name_07.content.size_ = 0xc;
    name_07.content.ptr = "structField";
    StructSchema::findFieldByName
              ((Maybe<capnp::StructSchema::Field> *)local_190,(StructSchema *)&local_260,name_07);
    if ((local_190[0] == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4d,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"structField\\\") != nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"structField\") != nullptr");
    }
    return;
  }
  StructSchema::getFields((FieldList *)local_190,(StructSchema *)&local_260);
  local_20c = local_188._24_4_;
  Schema::getProto((Reader *)local_1c8,(Schema *)&local_260);
  pWStack_1f0 = (WirePointer *)CONCAT44(local_1c8._28_4_,local_1c8._24_4_);
  local_1e8 = (void *)local_1c8._32_8_;
  pWStack_1e0 = pWStack_1a0;
  local_1f8 = (SegmentReader *)local_1c8._16_8_;
  local_208._0_8_ = local_1c8._0_8_;
  local_208._8_8_ = local_1c8._8_8_;
  capnp::schema::Node::Struct::Reader::getFields((Reader *)local_258,(Reader *)local_208);
  local_210 = local_240;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
             ,0x38,FAILED,
             "(schema.getFields().size()) == (schema.getProto().getStruct().getFields().size())",
             "schema.getFields().size(), schema.getProto().getStruct().getFields().size()",
             &local_20c,&local_210);
  kj::_::Debug::Fault::fatal(&local_218);
}

Assistant:

TEST(Schema, Structs) {
  StructSchema schema = Schema::from<TestAllTypes>();

  EXPECT_EQ(typeId<TestAllTypes>(), schema.getProto().getId());

  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>());
  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) != schema);
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>());
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == schema);
  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestDefaults>()));

  EXPECT_TRUE(schema.asStruct() == schema);
  EXPECT_NONFATAL_FAILURE(schema.asEnum());
  EXPECT_NONFATAL_FAILURE(schema.asInterface());

  ASSERT_EQ(schema.getFields().size(), schema.getProto().getStruct().getFields().size());
  StructSchema::Field field = schema.getFields()[0];
  EXPECT_EQ("voidField", field.getProto().getName());
  EXPECT_TRUE(field.getContainingStruct() == schema);

  StructSchema::Field lookup = schema.getFieldByName("voidField");
  EXPECT_TRUE(lookup == field);
  EXPECT_TRUE(lookup != schema.getFields()[1]);
  EXPECT_FALSE(lookup.getProto().getSlot().getHadExplicitDefault());

  EXPECT_FALSE(schema.getFieldByName("int32Field").getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(Schema::from<TestDefaults>().getFieldByName("int32Field")
      .getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(schema.findFieldByName("noSuchField") == nullptr);

  EXPECT_TRUE(schema.findFieldByName("int32Field") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("float32List") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("dataList") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("textField") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("structField") != nullptr);
}